

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O2

UniValue * __thiscall
wallet::DescribeWalletAddressVisitor::operator()
          (UniValue *__return_storage_ptr__,DescribeWalletAddressVisitor *this,PKHash *pkhash)

{
  long lVar1;
  SigningProvider *pSVar2;
  string str;
  string key;
  string key_00;
  int iVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  allocator<char> aVar5;
  Span<const_unsigned_char> s;
  undefined7 in_stack_fffffffffffffe48;
  allocator<char> in_stack_fffffffffffffe4f;
  undefined1 in_stack_fffffffffffffe50 [24];
  UniValue in_stack_fffffffffffffe68;
  string local_138;
  UniValue local_118;
  string local_c0 [39];
  CPubKey vchPubKey;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [20];
  CKeyID keyID;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ToKeyID(&keyID,pkhash);
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  str._M_dataplus._M_p._7_1_ = in_stack_fffffffffffffe4f;
  str._M_dataplus._M_p._0_7_ = in_stack_fffffffffffffe48;
  str._M_string_length = in_stack_fffffffffffffe50._0_8_;
  str.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 )in_stack_fffffffffffffe50._8_16_;
  UniValue::UniValue(__return_storage_ptr__,VOBJ,str);
  std::__cxx11::string::~string((string *)&local_58);
  vchPubKey.vch[0] = 0xff;
  pSVar2 = this->provider;
  if (pSVar2 != (SigningProvider *)0x0) {
    iVar3 = (*pSVar2->_vptr_SigningProvider[4])(pSVar2,&keyID,&vchPubKey);
    if ((char)iVar3 != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                (local_c0,"pubkey",(allocator<char> *)&stack0xfffffffffffffe4f);
      if ((vchPubKey.vch[0] & 0xfe) == 2) {
        sVar4 = 0x21;
      }
      else if ((byte)(vchPubKey.vch[0] - 4) < 4) {
        sVar4 = *(size_t *)(&DAT_003f01e0 + (ulong)(byte)(vchPubKey.vch[0] - 4) * 8);
      }
      else {
        sVar4 = 0;
      }
      s.m_size = sVar4;
      s.m_data = vchPubKey.vch;
      HexStr_abi_cxx11_(&local_138,s);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_118,&local_138);
      key._M_dataplus._M_p._7_1_ = in_stack_fffffffffffffe4f;
      key._M_dataplus._M_p._0_7_ = in_stack_fffffffffffffe48;
      key._M_string_length = in_stack_fffffffffffffe50._0_8_;
      key.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     )in_stack_fffffffffffffe50._8_16_;
      UniValue::pushKV(__return_storage_ptr__,key,in_stack_fffffffffffffe68);
      UniValue::~UniValue(&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffea8,"iscompressed",(allocator<char> *)&local_138);
      aVar5 = (allocator<char>)((vchPubKey.vch[0] & 0xfe) == 2);
      UniValue::UniValue<bool,_bool,_true>
                ((UniValue *)&stack0xfffffffffffffe50,(bool *)&stack0xfffffffffffffe4f);
      key_00._M_dataplus._M_p._7_1_ = aVar5;
      key_00._M_dataplus._M_p._0_7_ = in_stack_fffffffffffffe48;
      key_00._M_string_length = in_stack_fffffffffffffe50._0_8_;
      key_00.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )in_stack_fffffffffffffe50._8_16_;
      UniValue::pushKV(__return_storage_ptr__,key_00,in_stack_fffffffffffffe68);
      UniValue::~UniValue((UniValue *)&stack0xfffffffffffffe50);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const PKHash& pkhash) const
    {
        CKeyID keyID{ToKeyID(pkhash)};
        UniValue obj(UniValue::VOBJ);
        CPubKey vchPubKey;
        if (provider && provider->GetPubKey(keyID, vchPubKey)) {
            obj.pushKV("pubkey", HexStr(vchPubKey));
            obj.pushKV("iscompressed", vchPubKey.IsCompressed());
        }
        return obj;
    }